

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double ON_Length2d(double x,double y)

{
  double dVar1;
  undefined8 local_20;
  double len;
  double y_local;
  double x_local;
  
  y_local = ABS(x);
  dVar1 = ABS(y);
  len = dVar1;
  if (y_local < dVar1) {
    len = y_local;
    y_local = dVar1;
  }
  if (y_local <= 2.2250738585072014e-308) {
    if ((y_local <= 0.0) || ((y_local._6_2_ & 0x7ff0) == 0x7ff0)) {
      local_20 = 0.0;
    }
    else {
      local_20 = y_local;
    }
  }
  else {
    local_20 = sqrt((len / y_local) * (len / y_local) + 1.0);
    local_20 = y_local * local_20;
  }
  return local_20;
}

Assistant:

double ON_Length2d( double x, double y )
{
  double len;
  x = fabs(x);
  y = fabs(y);
  if ( y > x ) {
    len = x; x = y; y = len;
  }
 
  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/fx to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic vectors that have infinite length!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( x > ON_DBL_MIN )
  {
    y /= x;
    len = x*sqrt(1.0 + y*y);
  }
  else if ( x > 0.0 && ON_IS_FINITE(x) )
    len = x;
  else
    len = 0.0;

  return len;
}